

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectivePool(Parser *parser,int flags)

{
  pointer pCVar1;
  unique_ptr<ArmPoolCommand,_std::default_delete<ArmPoolCommand>_> local_60;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> local_58 [3];
  undefined4 local_40;
  Mode local_3c;
  unique_ptr<CDirectiveAlignFill,_std::default_delete<CDirectiveAlignFill>_> local_38;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> local_30;
  unique_ptr<CommandSequence,_std::default_delete<CommandSequence>_> local_28;
  __single_object seq;
  int flags_local;
  Parser *parser_local;
  
  std::make_unique<CommandSequence>();
  pCVar1 = std::unique_ptr<CommandSequence,_std::default_delete<CommandSequence>_>::operator->
                     (&local_28);
  local_3c = 4;
  local_40 = 1;
  std::make_unique<CDirectiveAlignFill,int,CDirectiveAlignFill::Mode>((int *)&local_38,&local_3c);
  std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
  unique_ptr<CDirectiveAlignFill,std::default_delete<CDirectiveAlignFill>,void>
            ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)&local_30,
             &local_38);
  CommandSequence::addCommand(pCVar1,&local_30);
  std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::~unique_ptr
            (&local_30);
  std::unique_ptr<CDirectiveAlignFill,_std::default_delete<CDirectiveAlignFill>_>::~unique_ptr
            (&local_38);
  pCVar1 = std::unique_ptr<CommandSequence,_std::default_delete<CommandSequence>_>::operator->
                     (&local_28);
  std::make_unique<ArmPoolCommand>();
  std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
  unique_ptr<ArmPoolCommand,std::default_delete<ArmPoolCommand>,void>
            ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)local_58,
             &local_60);
  CommandSequence::addCommand(pCVar1,local_58);
  std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::~unique_ptr(local_58)
  ;
  std::unique_ptr<ArmPoolCommand,_std::default_delete<ArmPoolCommand>_>::~unique_ptr(&local_60);
  std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
  unique_ptr<CommandSequence,std::default_delete<CommandSequence>,void>
            ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
             &local_28);
  std::unique_ptr<CommandSequence,_std::default_delete<CommandSequence>_>::~unique_ptr(&local_28);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectivePool(Parser& parser, int flags)
{
	auto seq = std::make_unique<CommandSequence>();
	seq->addCommand(std::make_unique<CDirectiveAlignFill>(4,CDirectiveAlignFill::AlignVirtual));
	seq->addCommand(std::make_unique<ArmPoolCommand>());

	return seq;
}